

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::initOperationMap(QMdiSubWindowPrivate *this)

{
  long in_FS_OFFSET;
  OperationInfo *in_stack_fffffffffffffe40;
  OperationInfo *value;
  CursorShape in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  uint changeFlags;
  OperationInfo *in_stack_fffffffffffffe50;
  OperationInfo *this_00;
  OperationInfo local_50;
  OperationInfo local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  OperationInfo::OperationInfo
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
             SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
             in_stack_fffffffffffffe50,
             (Operation *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             in_stack_fffffffffffffe40);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cc73);
  value = local_38;
  changeFlags = 5;
  OperationInfo::OperationInfo
            (in_stack_fffffffffffffe50,5,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
             in_stack_fffffffffffffe50,(Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),
             value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62ccd0);
  this_00 = &local_50;
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cd27);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cd7f);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cdd2);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62ce25);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62ce7d);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cecd);
  OperationInfo::OperationInfo
            (this_00,changeFlags,in_stack_fffffffffffffe48,SUB81((ulong)value >> 0x38,0));
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)this_00,
             (Operation *)CONCAT44(changeFlags,in_stack_fffffffffffffe48),value);
  OperationInfo::~OperationInfo((OperationInfo *)0x62cf1d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::initOperationMap()
{
    operationMap.insert(Move, OperationInfo(HMove | VMove, Qt::ArrowCursor, false));
    operationMap.insert(TopResize, OperationInfo(VMove | VResize | VResizeReverse, Qt::SizeVerCursor));
    operationMap.insert(BottomResize, OperationInfo(VResize, Qt::SizeVerCursor));
    operationMap.insert(LeftResize, OperationInfo(HMove | HResize | HResizeReverse, Qt::SizeHorCursor));
    operationMap.insert(RightResize, OperationInfo(HResize, Qt::SizeHorCursor));
    operationMap.insert(TopLeftResize, OperationInfo(HMove | VMove | HResize | VResize | VResizeReverse
                                                     | HResizeReverse, Qt::SizeFDiagCursor));
    operationMap.insert(TopRightResize, OperationInfo(VMove | HResize | VResize
                                                      | VResizeReverse, Qt::SizeBDiagCursor));
    operationMap.insert(BottomLeftResize, OperationInfo(HMove | HResize | VResize | HResizeReverse,
                                                        Qt::SizeBDiagCursor));
    operationMap.insert(BottomRightResize, OperationInfo(HResize | VResize, Qt::SizeFDiagCursor));
}